

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

Abc_Nam_t * Abc_NtkNameMan(Abc_Ntk_t *p,int fOuts)

{
  int iVar1;
  Abc_Nam_t *p_00;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int iVar4;
  
  if (fOuts == 0) {
    p_00 = Abc_NamStart(p->vCis->nSize,0x18);
    for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkCi(p,iVar4);
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_NamStrFindOrAdd(p_00,pcVar3,(int *)0x0);
    }
    iVar1 = Abc_NamObjNumMax(p_00);
    if (iVar4 - iVar1 != -1) {
      __assert_fail("Abc_NamObjNumMax(pStrsCi) == i + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x180,"Abc_Nam_t *Abc_NtkNameMan(Abc_Ntk_t *, int)");
    }
  }
  else {
    p_00 = Abc_NamStart(p->vCos->nSize,0x18);
    for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
      pAVar2 = Abc_NtkCo(p,iVar4);
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_NamStrFindOrAdd(p_00,pcVar3,(int *)0x0);
    }
    iVar1 = Abc_NamObjNumMax(p_00);
    if (iVar4 - iVar1 != -1) {
      __assert_fail("Abc_NamObjNumMax(pStrsCo) == i + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x177,"Abc_Nam_t *Abc_NtkNameMan(Abc_Ntk_t *, int)");
    }
  }
  return p_00;
}

Assistant:

Abc_Nam_t * Abc_NtkNameMan( Abc_Ntk_t * p, int fOuts )
{
    if ( fOuts )
    {
        Abc_Obj_t * pObj;  int i;
        Abc_Nam_t * pStrsCo = Abc_NamStart( Abc_NtkCoNum(p), 24 );
        Abc_NtkForEachCo( p, pObj, i )
            Abc_NamStrFindOrAdd( pStrsCo, Abc_ObjName(pObj), NULL );
        assert( Abc_NamObjNumMax(pStrsCo) == i + 1 );
        return pStrsCo;
    }
    else
    {
        Abc_Obj_t * pObj;  int i;
        Abc_Nam_t * pStrsCi = Abc_NamStart( Abc_NtkCiNum(p), 24 );
        Abc_NtkForEachCi( p, pObj, i )
            Abc_NamStrFindOrAdd( pStrsCi, Abc_ObjName(pObj), NULL );
        assert( Abc_NamObjNumMax(pStrsCi) == i + 1 );
        return pStrsCi;
   }
}